

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow_*> *windows,char *label)

{
  ImVector<unsigned_int> *pIVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = TreeNode(label,"%s (%d)",label,(ulong)(uint)windows->Size);
  if (bVar2) {
    Text("(In front-to-back order:)");
    if (0 < (long)windows->Size) {
      lVar3 = (long)windows->Size + 1;
      do {
        PushID(windows->Data[lVar3 + -2]);
        DebugNodeWindow(windows->Data[lVar3 + -2],"Window");
        pIVar1 = &GImGui->CurrentWindow->IDStack;
        pIVar1->Size = pIVar1->Size + -1;
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow*>* windows, const char* label)
{
    if (!TreeNode(label, "%s (%d)", label, windows->Size))
        return;
    Text("(In front-to-back order:)");
    for (int i = windows->Size - 1; i >= 0; i--) // Iterate front to back
    {
        PushID((*windows)[i]);
        DebugNodeWindow((*windows)[i], "Window");
        PopID();
    }
    TreePop();
}